

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool Font2Span(TidyDocImpl *doc,Node *node,Node **pnode)

{
  AttVal *pAVar1;
  Bool BVar2;
  AttVal *next;
  AttVal *style;
  AttVal *av;
  Node **pnode_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_FONT)) {
    doc_local._4_4_ = no;
  }
  else if (((node->parent->content == node) && (node->next == (Node *)0x0)) &&
          (BVar2 = CanApplyBlockStyle(node->parent), BVar2 != no)) {
    doc_local._4_4_ = no;
  }
  else {
    AddFontStyles(doc,node,node->attributes);
    next = (AttVal *)0x0;
    style = node->attributes;
    while (style != (AttVal *)0x0) {
      pAVar1 = style->next;
      if (((style == (AttVal *)0x0) || (style->dict == (Attribute *)0x0)) ||
         (style->dict->id != TidyAttr_STYLE)) {
        prvTidyFreeAttribute(doc,style);
        style = pAVar1;
      }
      else {
        style->next = (AttVal *)0x0;
        next = style;
        style = pAVar1;
      }
    }
    node->attributes = next;
    RenameElem(doc,node,TidyTag_SPAN);
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

static Bool Font2Span( TidyDocImpl* doc, Node *node, Node **pnode )
{
    AttVal *av, *style, *next;

    if ( nodeIsFONT(node) )
    {
        /* if node is the only child of parent element then leave alone
          Do so only if BlockStyle may be succesful. */
        if ( node->parent->content == node && node->next == NULL &&
             CanApplyBlockStyle(node->parent) )
            return no;

        AddFontStyles( doc, node, node->attributes );

        /* extract style attribute and free the rest */
        av = node->attributes;
        style = NULL;

        while (av)
        {
            next = av->next;

            if (attrIsSTYLE(av))
            {
                av->next = NULL;
                style = av;
            }
            else
            {
                TY_(FreeAttribute)( doc, av );
            }
            av = next;
        }

        node->attributes = style;
        RenameElem( doc, node, TidyTag_SPAN );
        return yes;
    }

    return no;
}